

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O1

string * __thiscall
tinyusdz::tydra::to_string_abi_cxx11_
          (string *__return_storage_ptr__,tydra *this,VertexVariability v)

{
  char *pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  switch((ulong)this & 0xffffffff) {
  case 0:
    pcVar1 = "constant";
    break;
  case 1:
    pcVar1 = "uniform";
    break;
  case 2:
    pcVar1 = "varying";
    break;
  case 3:
    pcVar1 = "vertex";
    break;
  case 4:
    pcVar1 = "facevarying";
    break;
  case 5:
    pcVar1 = "indexed";
    break;
  default:
    goto switchD_003405f1_default;
  }
  ::std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,(ulong)pcVar1);
switchD_003405f1_default:
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(VertexVariability v) {
  std::string s;

  switch (v) {
    case VertexVariability::Constant: {
      s = "constant";
      break;
    }
    case VertexVariability::Uniform: {
      s = "uniform";
      break;
    }
    case VertexVariability::Varying: {
      s = "varying";
      break;
    }
    case VertexVariability::Vertex: {
      s = "vertex";
      break;
    }
    case VertexVariability::FaceVarying: {
      s = "facevarying";
      break;
    }
    case VertexVariability::Indexed: {
      s = "indexed";
      break;
    }
  }

  return s;
}